

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Multi_field_small.h
# Opt level: O3

bool Gudhi::persistence_fields::
     Multi_field_element_with_small_characteristics<5U,_13U,_unsigned_int,_void>::_is_prime(uint p)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  
  if (p < 2) {
    bVar2 = false;
  }
  else {
    if (3 < p) {
      if ((p & 1) == 0) {
        return false;
      }
      uVar1 = (ulong)p;
      if (p % 3 == 0) {
        return false;
      }
      if (0x18 < p) {
        uVar3 = 5;
        do {
          if (uVar1 % uVar3 == 0) {
            return false;
          }
          if (uVar1 % (uVar3 + 2) == 0) {
            return false;
          }
          uVar3 = uVar3 + 6;
        } while (uVar3 * uVar3 < uVar1 || uVar3 * uVar3 - uVar1 == 0);
      }
    }
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

static constexpr bool _is_prime(const unsigned int p) {
    if (p <= 1) return false;
    if (p <= 3) return true;
    if (p % 2 == 0 || p % 3 == 0) return false;

    for (unsigned long i = 5; i * i <= p; i = i + 6)
      if (p % i == 0 || p % (i + 2) == 0) return false;

    return true;
  }